

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

int __thiscall
icu_63::GregorianCalendar::clone
          (GregorianCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  GregorianCalendar *this_00;
  undefined8 local_30;
  GregorianCalendar *this_local;
  
  this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  local_30 = (GregorianCalendar *)0x0;
  if (this_00 != (GregorianCalendar *)0x0) {
    GregorianCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar* GregorianCalendar::clone() const
{
    return new GregorianCalendar(*this);
}